

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::cleanup_root(Container *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  path *ppVar3;
  ContextManager *pCVar4;
  value_type *pvVar5;
  undefined8 uVar6;
  string local_260;
  string local_240;
  directory_entry *local_220;
  directory_entry *path_2;
  undefined1 local_208 [8];
  directory_iterator __end1_2;
  undefined1 local_1e8 [8];
  directory_iterator __begin1_2;
  directory_iterator *__range1_2;
  string local_1a0;
  directory_entry *local_180;
  directory_entry *path_1;
  undefined1 local_168 [8];
  directory_iterator __end1_1;
  undefined1 local_148 [8];
  directory_iterator __begin1_1;
  path local_110;
  directory_iterator local_e8;
  directory_iterator *local_d8;
  directory_iterator *__range1_1;
  string local_b0;
  directory_entry *local_80;
  directory_entry *path;
  undefined1 local_68 [8];
  directory_iterator __end1;
  undefined1 local_48 [8];
  directory_iterator __begin1;
  directory_iterator *__range1;
  error_code error;
  Container *this_local;
  
  error._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)&__range1);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount,&this->work_dir_);
  p_Var1 = &__begin1._M_dir._M_refcount;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,(directory_iterator *)p_Var1);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_48,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&path,(directory_iterator *)p_Var1);
  std::filesystem::__cxx11::end((directory_iterator *)local_68);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&path);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_48,(directory_iterator *)local_68), bVar2) {
    local_80 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_48);
    ppVar3 = std::filesystem::__cxx11::directory_entry::operator_cast_to_path_(local_80);
    std::filesystem::remove_all(ppVar3,(error_code *)&__range1);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&__range1);
    if (bVar2) {
      pCVar4 = ContextManager::get();
      ppVar3 = std::filesystem::__cxx11::directory_entry::path(local_80);
      pvVar5 = std::filesystem::__cxx11::path::c_str(ppVar3);
      std::error_code::message_abi_cxx11_((string *)&__range1_1,(error_code *)&__range1);
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_(&local_b0,"Cannot remove %s: %s",pvVar5,uVar6);
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&__range1_1);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_48);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_68);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_48);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__begin1._M_dir._M_refcount);
  p_Var1 = &__begin1_1._M_dir._M_refcount;
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            ((path *)p_Var1,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_110,&this->root_,(path *)p_Var1);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_e8,&local_110);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::filesystem::__cxx11::path::~path((path *)&__begin1_1._M_dir._M_refcount);
  local_d8 = &local_e8;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1_1._M_dir._M_refcount,local_d8);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_148,(directory_iterator *)&__end1_1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1_1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&path_1,local_d8);
  std::filesystem::__cxx11::end((directory_iterator *)local_168);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&path_1);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_148,(directory_iterator *)local_168), bVar2)
  {
    local_180 = (directory_entry *)
                std::filesystem::__cxx11::directory_iterator::operator*
                          ((directory_iterator *)local_148);
    ppVar3 = std::filesystem::__cxx11::directory_entry::operator_cast_to_path_(local_180);
    std::filesystem::remove_all(ppVar3,(error_code *)&__range1);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&__range1);
    if (bVar2) {
      pCVar4 = ContextManager::get();
      ppVar3 = std::filesystem::__cxx11::directory_entry::path(local_180);
      pvVar5 = std::filesystem::__cxx11::path::c_str(ppVar3);
      std::error_code::message_abi_cxx11_((string *)&__range1_2,(error_code *)&__range1);
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_(&local_1a0,"Cannot remove %s: %s",pvVar5,uVar6);
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&__range1_2);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_148);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_168)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_148)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_e8);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__begin1_2._M_dir._M_refcount,&this->work_dir_);
  p_Var1 = &__begin1_2._M_dir._M_refcount;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1_2._M_dir._M_refcount,(directory_iterator *)p_Var1);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_1e8,(directory_iterator *)&__end1_2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1_2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&path_2,(directory_iterator *)p_Var1);
  std::filesystem::__cxx11::end((directory_iterator *)local_208);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&path_2);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_1e8,(directory_iterator *)local_208), bVar2)
  {
    local_220 = (directory_entry *)
                std::filesystem::__cxx11::directory_iterator::operator*
                          ((directory_iterator *)local_1e8);
    ppVar3 = std::filesystem::__cxx11::directory_entry::operator_cast_to_path_(local_220);
    std::filesystem::remove_all(ppVar3,(error_code *)&__range1);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&__range1);
    if (bVar2) {
      pCVar4 = ContextManager::get();
      ppVar3 = std::filesystem::__cxx11::directory_entry::path(local_220);
      pvVar5 = std::filesystem::__cxx11::path::c_str(ppVar3);
      std::error_code::message_abi_cxx11_(&local_260,(error_code *)&__range1);
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_(&local_240,"Cannot remove %s: %s",pvVar5,uVar6);
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_1e8);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_208)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_1e8)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__begin1_2._M_dir._M_refcount);
  return;
}

Assistant:

void Container::cleanup_root() {
    std::error_code error;
    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(root_ / "tmp")) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }
}